

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForkNode.cpp
# Opt level: O2

bool __thiscall ForkNode::removeForkSuccessor(ForkNode *this,EntryNode *entryNode)

{
  size_type sVar1;
  bool bVar2;
  EntryNode *local_28;
  ForkNode *local_20;
  
  if (entryNode == (EntryNode *)0x0) {
    bVar2 = false;
  }
  else {
    local_28 = entryNode;
    std::
    _Rb_tree<EntryNode_*,_EntryNode_*,_std::_Identity<EntryNode_*>,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_>
    ::erase(&(this->forkSuccessors_)._M_t,&local_28);
    local_20 = this;
    sVar1 = std::
            _Rb_tree<ForkNode_*,_ForkNode_*,_std::_Identity<ForkNode_*>,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>
            ::erase(&(local_28->forkPredecessors_)._M_t,&local_20);
    bVar2 = sVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool ForkNode::removeForkSuccessor(EntryNode *entryNode) {
    if (!entryNode) {
        return false;
    }
    forkSuccessors_.erase(entryNode);
    return entryNode->forkPredecessors_.erase(this);
}